

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mullhwu(DisasContext_conflict10 *ctx)

{
  uint32_t ra;
  uint32_t rb;
  uint32_t rt;
  uint32_t Rc;
  DisasContext_conflict10 *ctx_local;
  
  ra = rA(ctx->opcode);
  rb = rB(ctx->opcode);
  rt = rD(ctx->opcode);
  Rc = ::Rc(ctx->opcode);
  gen_405_mulladd_insn(ctx,8,0xc,ra,rb,rt,Rc);
  return;
}

Assistant:

static void gen_mfdcr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv dcrn;

    CHK_SV;
    dcrn = tcg_const_tl(tcg_ctx, SPR(ctx->opcode));
    gen_helper_load_dcr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, dcrn);
    tcg_temp_free(tcg_ctx, dcrn);
}